

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

void __thiscall Node::OutputMap(Node *this,ostream *os)

{
  VariableStruct *this_00;
  ostream *poVar1;
  string sStack_a8;
  string local_88;
  string local_68;
  string local_48;
  
  this_00 = VariableList::Lookup(Variables,&this->Tree[0]->TextValue,(Node *)0x0,0);
  poVar1 = std::endl<char,std::char_traits<char>>(os);
  Indent_abi_cxx11_(&local_88,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_88);
  poVar1 = std::operator<<(poVar1,"// #pragma psect static_rw ");
  VariableStruct::GetName_abi_cxx11_(&sStack_a8,this_00,1);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_a8);
  poVar1 = std::operator<<(poVar1,",gbl,ovr");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_a8);
  std::__cxx11::string::~string((string *)&local_88);
  if ((this->Tree[1]->Type == 0x1d8) && (this->Tree[1]->Block[0] == (Node *)0x0)) {
    Indent_abi_cxx11_(&local_88,this);
    poVar1 = std::operator<<(os,(string *)&local_88);
    poVar1 = std::operator<<(poVar1,"class ");
    VariableStruct::GetName_abi_cxx11_(&sStack_a8,this_00,1);
    poVar1 = std::operator<<(poVar1,(string *)&sStack_a8);
    poVar1 = std::operator<<(poVar1,"_C : public ");
    OutputNodeVarType_abi_cxx11_(&local_48,this->Tree[1]->Tree[1]);
    poVar1 = std::operator<<(poVar1,(string *)&local_48);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    Indent_abi_cxx11_(&local_68,this);
    poVar1 = std::operator<<(poVar1,(string *)&local_68);
    poVar1 = std::operator<<(poVar1,"{");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&sStack_a8);
    std::__cxx11::string::~string((string *)&local_88);
    Indent_abi_cxx11_(&local_88,this);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_88);
    poVar1 = std::operator<<(poVar1,"} ");
    Expression_abi_cxx11_(&sStack_a8,this->Tree[1]->Tree[0]);
    poVar1 = std::operator<<(poVar1,(string *)&sStack_a8);
    poVar1 = std::operator<<(poVar1,";");
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    Indent_abi_cxx11_(&local_88,this);
    poVar1 = std::operator<<(os,(string *)&local_88);
    poVar1 = std::operator<<(poVar1,"class ");
    VariableStruct::GetName_abi_cxx11_(&sStack_a8,this_00,1);
    poVar1 = std::operator<<(poVar1,(string *)&sStack_a8);
    poVar1 = std::operator<<(poVar1,"_C");
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    Indent_abi_cxx11_(&local_48,this);
    poVar1 = std::operator<<(poVar1,(string *)&local_48);
    poVar1 = std::operator<<(poVar1,"{");
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    Indent_abi_cxx11_(&local_68,this);
    poVar1 = std::operator<<(poVar1,(string *)&local_68);
    poVar1 = std::operator<<(poVar1,"public:");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&sStack_a8);
    std::__cxx11::string::~string((string *)&local_88);
    if (this->Tree[1] != (Node *)0x0) {
      Level = Level + 1;
      OutputDefinitionList(this->Tree[1],os,(Node *)0x0,0,0);
      Level = Level + -1;
    }
    Indent_abi_cxx11_(&local_88,this);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_88);
    poVar1 = std::operator<<(poVar1,"} ");
    VariableStruct::GetName_abi_cxx11_(&sStack_a8,this_00,1);
    poVar1 = std::operator<<(poVar1,(string *)&sStack_a8);
    poVar1 = std::operator<<(poVar1,";");
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::__cxx11::string::~string((string *)&sStack_a8);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

void Node::OutputMap(
	std::ostream& os		/**< iostream to write C++ code to */
)
{
	VariableStruct* ThisVar = Variables->Lookup(Tree[0]->TextValue, 0);

	os << std::endl << Indent() <<
		"// #pragma psect static_rw " << ThisVar->GetName(1) <<
		",gbl,ovr" << std::endl;

	//
	// We implement MAP and COMMON as classes because dealing with
	// their weirdness will be easier by creating methods in a base
	// class than putting stuff in the actual source. It should also
	// make putting everything in a common place simpler.
	//
	// Here we try to 'roll up' a MAP statement of the form
	//	MAP (my_map) my_regord my_var
	// into a shorder form than more comples MAPs. It means we can
	// rever to the values as 'my_var.value' instead of
	// 'my_map.my_var.value'.
	// Similiar code must exist in program.cc arount the prefix
	// generating code
	//
	if ((Tree[1]->Type == BAS_V_DEFINEVAR) && (Tree[1]->Block[0] == 0))
	{
		os <<
			Indent() << "class " << ThisVar->GetName(1) <<
				"_C : public " <<
				Tree[1]->Tree[1]->OutputNodeVarType() <<
				std::endl <<
			Indent() << "{" << std::endl;

		std::cout <<
			Indent() << "} " << Tree[1]->Tree[0]->Expression() <<
				";" << std::endl <<
			std::endl;
	}
	else
	{
		os <<
			Indent() << "class " << ThisVar->GetName(1) <<
				"_C" << std::endl <<
			Indent() << "{" << std::endl <<
			Indent() << "public:" << std::endl;

		Level++;

		if (Tree[1] != 0)
		{
			Tree[1]->OutputDefinitionList(os, 0, 0);
		}

		Level--;
		std::cout <<
			Indent() << "} " << ThisVar->GetName(1) << ";" << std::endl <<
			std::endl;
	}

//	os << "// #pragma psect end " << ThisVar->GetName() << std::endl;
}